

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O1

void __thiscall
dummy_api::dummy_api
          (dummy_api *this,service *srv,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *env,string *output,bool mark_chunks,bool write_eof)

{
  char *pcVar1;
  size_t sVar2;
  char *key;
  char *value;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  cppcms::impl::cgi::connection::connection(&this->super_connection,srv);
  *(undefined ***)this = &PTR__dummy_api_00110af0;
  this->output_ = output;
  this->write_eof_ = write_eof;
  this->mark_chunks_ = mark_chunks;
  (this->headers_)._M_dataplus._M_p = (pointer)&(this->headers_).field_2;
  (this->headers_)._M_string_length = 0;
  (this->headers_).field_2._M_local_buf[0] = '\0';
  this->headers_written_ = false;
  p_Var3 = (env->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(env->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      pcVar1 = *(char **)(p_Var3 + 1);
      sVar2 = strlen(pcVar1);
      key = cppcms::impl::string_pool::allocate_space((string_pool *)&this->field_0x18,sVar2 + 1);
      memcpy(key,pcVar1,sVar2);
      key[sVar2] = '\0';
      pcVar1 = *(char **)(p_Var3 + 2);
      sVar2 = strlen(pcVar1);
      value = cppcms::impl::string_pool::allocate_space((string_pool *)&this->field_0x18,sVar2 + 1);
      memcpy(value,pcVar1,sVar2);
      value[sVar2] = '\0';
      cppcms::impl::string_map::add((string_map *)&this->field_0x38,key,value);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

dummy_api(cppcms::service &srv,std::map<std::string,std::string> env,std::string &output,bool mark_chunks=false,bool write_eof=false) :
		cppcms::impl::cgi::connection(srv),
		output_(&output),
		write_eof_(write_eof),
		mark_chunks_(mark_chunks),
		headers_written_(false)
	{
		for(std::map<std::string,std::string>::iterator p=env.begin();p!=env.end();++p)
			env_.add(pool_.add(p->first),pool_.add(p->second));

	}